

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

void FIX::thread_join(thread_id thread)

{
  thread_id thread_local;
  
  pthread_join(thread,(void **)0x0);
  return;
}

Assistant:

void thread_join(thread_id thread) {
#ifdef _MSC_VER
  WaitForSingleObject((void *)thread, INFINITE);
  CloseHandle(thread);
#else
  pthread_join((pthread_t)thread, 0);
#endif
}